

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void EDCircles::sortCircle(Circle *circles,int noCircles)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  Circle t;
  undefined1 local_c8 [152];
  
  if (1 < noCircles) {
    pdVar8 = &circles[1].r;
    uVar7 = 1;
    uVar5 = 0;
    do {
      uVar6 = uVar5 + 1;
      uVar4 = uVar5 & 0xffffffff;
      pdVar2 = pdVar8;
      uVar3 = uVar7;
      do {
        uVar1 = uVar3 & 0xffffffff;
        if (*pdVar2 < circles[(int)uVar4].r || *pdVar2 == circles[(int)uVar4].r) {
          uVar1 = uVar4;
        }
        uVar4 = uVar1;
        uVar3 = uVar3 + 1;
        pdVar2 = pdVar2 + 0x13;
      } while ((uint)noCircles != uVar3);
      if (uVar5 != uVar4) {
        memcpy(local_c8,circles + uVar5,0x98);
        memcpy(circles + uVar5,circles + (int)uVar4,0x98);
        memcpy(circles + (int)uVar4,local_c8,0x98);
      }
      uVar7 = uVar7 + 1;
      pdVar8 = pdVar8 + 0x13;
      uVar5 = uVar6;
    } while (uVar6 != noCircles - 1);
  }
  return;
}

Assistant:

void EDCircles::sortCircle(Circle * circles, int noCircles)
{
	for (int i = 0; i<noCircles - 1; i++) {
		int max = i;
		for (int j = i + 1; j<noCircles; j++) {
			if (circles[j].r > circles[max].r) max = j;
		} //end-for

		if (max != i) {
			Circle t = circles[i];
			circles[i] = circles[max];
			circles[max] = t;
		} // end-if
	} //end-for
}